

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall Cli::App::debug(App *this)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  pointer ppVar6;
  int local_34;
  iterator iStack_30;
  int i_1;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  iterator pos;
  int i;
  App *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Arguments : ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pos._M_node._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)pos._M_node._4_4_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->args);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->args,(long)pos._M_node._4_4_);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pos._M_node._4_4_ = pos._M_node._4_4_ + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Options : ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->options);
  local_20._M_node = local_28;
  while( true ) {
    iStack_30 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->options);
    bVar1 = std::operator!=(&local_20,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_20);
    bVar1 = std::operator!=(&ppVar6->second,"");
    if (bVar1) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)ppVar6);
      poVar2 = std::operator<<(poVar2," = ");
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      poVar2 = std::operator<<(poVar2,(string *)&ppVar6->second);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&local_20);
      poVar2 = std::operator<<((ostream *)&std::cerr,(string *)ppVar6);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_20);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Flags : ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_34 = 0;
  while( true ) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->flags);
    if (sVar4 <= (ulong)(long)local_34) break;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&this->flags,(long)local_34);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)pvVar5);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void App::debug(){
        std::cerr << "Arguments : " << std::endl;
        for(int i = 0 ; i< args.size(); i++){
            std::cerr << args.at(i) << std::endl;
        }


        std::cerr << "Options : " << std::endl;
        std::map<std::string, std::string>::iterator pos;
        for (pos = options.begin(); pos != options.end(); ++pos) {
            if(pos->second != "")
                std::cerr << pos->first << " = " << pos->second << std::endl;
            else
                std::cerr << pos->first << std::endl;

        }

        std::cerr << "Flags : " << std::endl;
        for(int i = 0 ; i< flags.size(); i++){
            std::cerr << flags.at(i) << std::endl;
        }
    }